

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint64_t helper_neon_qshl_s64_arm(CPUARMState *env,uint64_t valop,uint64_t shiftop)

{
  uint64_t uVar1;
  byte bVar2;
  
  bVar2 = (byte)shiftop;
  if ((char)bVar2 < '@') {
    if ((char)bVar2 < -0x3f) {
      return (long)valop >> 0x3f;
    }
    if ((char)bVar2 < '\0') {
      return (long)valop >> (-bVar2 & 0x3f);
    }
    uVar1 = valop << (bVar2 & 0x3f);
    if ((long)uVar1 >> (bVar2 & 0x3f) == valop) {
      return uVar1;
    }
  }
  else if (valop == 0) {
    return 0;
  }
  (env->vfp).qc[0] = 1;
  uVar1 = 0x8000000000000000;
  if (-1 < (long)valop) {
    uVar1 = 0x7fffffffffffffff;
  }
  return uVar1;
}

Assistant:

uint64_t HELPER(neon_qshl_s64)(CPUARMState *env, uint64_t valop, uint64_t shiftop)
{
    int8_t shift = (uint8_t)shiftop;
    int64_t val = valop;
    if (shift >= 64) {
        if (val) {
            SET_QC();
            val = (val >> 63) ^ ~SIGNBIT64;
        }
    } else if (shift <= -64) {
        val >>= 63;
    } else if (shift < 0) {
        val >>= -shift;
    } else {
        int64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = (tmp >> 63) ^ ~SIGNBIT64;
        }
    }
    return val;
}